

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spdlog-inl.h
# Opt level: O0

void spdlog::apply_logger_env_levels(shared_ptr<spdlog::logger> *logger)

{
  shared_ptr<spdlog::logger> *in_RDI;
  shared_ptr<spdlog::logger> *in_stack_00000008;
  registry *in_stack_00000010;
  shared_ptr<spdlog::logger> *in_stack_ffffffffffffffb8;
  
  details::registry::instance();
  std::shared_ptr<spdlog::logger>::shared_ptr(in_RDI,in_stack_ffffffffffffffb8);
  details::registry::apply_logger_env_levels(in_stack_00000010,in_stack_00000008);
  CLI::std::shared_ptr<spdlog::logger>::~shared_ptr((shared_ptr<spdlog::logger> *)0x6b3657);
  return;
}

Assistant:

SPDLOG_INLINE void apply_logger_env_levels(std::shared_ptr<logger> logger) {
    details::registry::instance().apply_logger_env_levels(std::move(logger));
}